

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall QOpenGLTexture::allocateStorage(QOpenGLTexture *this)

{
  PixelFormat PVar1;
  QOpenGLTexturePrivate *pQVar2;
  bool bVar3;
  ulong uVar4;
  PixelType extraout_EDX;
  PixelFormat PVar5;
  PixelFormat in_ESI;
  QOpenGLTexturePrivate *pQVar7;
  PixelType PVar6;
  
  pQVar2 = (this->d_ptr).d;
  pQVar7 = pQVar2;
  bVar3 = QOpenGLTexturePrivate::create(pQVar2);
  if (!bVar3) {
    return;
  }
  PVar1 = pQVar2->format;
  PVar6 = extraout_EDX;
  if (0x8d87 < (int)PVar1) {
    if ((int)PVar1 < 0x93b0) {
      if ((int)PVar1 < 0x8f94) {
        switch(PVar1) {
        case 0x8d88:
        case 0x8d8e:
switchD_00158424_caseD_8d82:
          PVar5 = 0x1400;
LAB_001584db:
          in_ESI = RGBA_Integer;
          goto switchD_0015866d_caseD_8229;
        case 0x8d89:
        case 0x8d8f:
switchD_00158424_caseD_8d83:
          PVar5 = 0x1400;
LAB_001585b0:
          in_ESI = RGB_Integer;
          goto switchD_0015866d_caseD_8229;
        case 0x8d8a:
        case 0x8d8b:
        case 0x8d8c:
        case 0x8d8d:
          goto code_r0x00158844;
        }
        goto switchD_00158581_caseD_8c41;
      }
      switch(PVar1) {
      case 0x9270:
      case 0x9271:
        PVar5 = Red;
        break;
      case 0x9272:
      case 0x9273:
        PVar5 = RG;
        break;
      case 0x9274:
      case 0x9275:
        PVar5 = RGB;
        break;
      case 0x9276:
      case 0x9277:
      case 0x9278:
      case 0x9279:
        goto switchD_00158581_caseD_8c41;
      default:
        switch(PVar1) {
        case 0x8f94:
        case 0x8f98:
          PVar5 = 0x1400;
          goto LAB_001587ee;
        case 0x8f95:
        case 0x8f99:
          PVar5 = 0x1400;
          goto LAB_001587e2;
        case 0x8f96:
        case 0x8f9a:
          PVar5 = 0x1400;
          goto LAB_001587ba;
        case 0x8f97:
        case 0x8f9b:
          PVar5 = 0x1400;
          break;
        default:
          PVar5 = 0x8036;
        }
        goto LAB_001587fa;
      }
    }
    else {
      PVar6 = 0x3fff;
      if ((0x3fff00003fffU >> ((ulong)(PVar1 - 0x93b0) & 0x3f) & 1) == 0) goto code_r0x00158844;
switchD_00158581_caseD_8c41:
      PVar5 = RGBA;
    }
switchD_0015855b_default:
    in_ESI = PVar5;
    PVar6 = UInt8;
    PVar5 = 0x1401;
    if (0x8d87 < (int)PVar1) {
      if (0x93af < (int)PVar1) {
        if ((0x3fff00003fffU >> ((ulong)(PVar1 - 0x93b0) & 0x3f) & 1) == 0) {
code_r0x00158844:
          pQVar2 = (QOpenGLTexturePrivate *)pQVar7->q_ptr;
          bVar3 = QOpenGLTexturePrivate::create(pQVar2);
          if (bVar3) {
            QOpenGLTexturePrivate::allocateStorage(pQVar2,in_ESI,PVar6);
            return;
          }
          return;
        }
        goto switchD_0015866d_caseD_8229;
      }
      if (((PVar1 - 0x9270 < 10) || (0x36 < PVar1 - 0x8d88)) ||
         ((0xc3UL >> ((ulong)(PVar1 - 0x8d88) & 0x3f) & 1) == 0)) goto switchD_0015866d_caseD_8229;
switchD_0015866d_caseD_8231:
      PVar5 = 0x1400;
      goto switchD_0015866d_caseD_8229;
    }
    if ((int)PVar1 < 0x8814) {
      if (0x83ef < (int)PVar1) goto switchD_0015866d_caseD_8229;
      switch(PVar1) {
      case 0x8229:
      case 0x822a:
      case 0x822b:
      case 0x822c:
      case 0x8232:
      case 0x8234:
      case 0x8236:
      case 0x8238:
      case 0x823a:
      case 0x823c:
        break;
      case 0x822d:
      case 0x822f:
switchD_0015866d_caseD_822d:
        PVar5 = 0x140b;
        break;
      case 0x822e:
      case 0x8230:
        goto switchD_0015866d_caseD_822e;
      case 0x8231:
      case 0x8233:
      case 0x8235:
      case 0x8237:
      case 0x8239:
      case 0x823b:
        goto switchD_0015866d_caseD_8231;
      default:
        if (PVar1 - 0x81a6 < 2) {
          PVar5 = 0x1405;
        }
        else {
          PVar5 = 0x1403;
        }
      }
    }
    else {
      if ((int)PVar1 < 0x8cac) {
        if (0x8c39 < (int)PVar1) {
          switch(PVar1) {
          case 0x8c3a:
            PVar5 = 0x8c3b;
            break;
          case 0x8c3b:
          case 0x8c3c:
          case 0x8c3e:
          case 0x8c3f:
          case 0x8c40:
          case 0x8c42:
            goto code_r0x00158844;
          case 0x8c3d:
            PVar5 = 0x8366;
          }
          goto switchD_0015866d_caseD_8229;
        }
        if (1 < PVar1 - 0x8814) {
          if (1 < PVar1 - 0x881a) {
            PVar5 = 0x84fa;
            goto switchD_0015866d_caseD_8229;
          }
          goto switchD_0015866d_caseD_822d;
        }
      }
      else {
        uVar4 = (ulong)(PVar1 - 0x8d48);
        if (PVar1 - 0x8d48 < 0x3c) {
          if ((0x30c30010000001U >> (uVar4 & 0x3f) & 1) != 0) goto switchD_0015866d_caseD_8229;
          if ((0xc00000000000000U >> (uVar4 & 0x3f) & 1) != 0) goto switchD_0015866d_caseD_8231;
          if (uVar4 == 0x1a) {
            PVar5 = 0x8363;
            goto switchD_0015866d_caseD_8229;
          }
        }
        if (PVar1 != 0x8cac) {
          PVar5 = 0x8dad;
          goto switchD_0015866d_caseD_8229;
        }
      }
switchD_0015866d_caseD_822e:
      PVar5 = 0x1406;
    }
    goto switchD_0015866d_caseD_8229;
  }
  in_ESI = Depth;
  PVar5 = Depth;
  if (0x83ef < (int)PVar1) {
    if ((int)PVar1 < 0x8c4c) {
      if (0x88ef < (int)PVar1) {
        PVar6 = 0x17f8f0;
        switch(PVar1) {
        case 0x8c3a:
          PVar5 = 0x8c3b;
          break;
        case 0x8c3b:
        case 0x8c3c:
        case 0x8c3e:
        case 0x8c3f:
        case 0x8c40:
        case 0x8c42:
          goto code_r0x00158844;
        case 0x8c3d:
          PVar5 = 0x8366;
          break;
        case 0x8c41:
        case 0x8c43:
          goto switchD_00158581_caseD_8c41;
        default:
          goto switchD_00158581_default;
        }
LAB_001587ba:
        in_ESI = RGB;
        goto switchD_0015866d_caseD_8229;
      }
      if (3 < PVar1 - 0x83f0) {
        (*(code *)(&DAT_0017f8d0 + *(int *)(&DAT_0017f8d0 + (ulong)(PVar1 - 0x8814) * 4)))();
        return;
      }
    }
    else if ((int)PVar1 < 0x8d62) {
      if (0x8cab < (int)PVar1) {
        if (PVar1 == 0x8cac) goto switchD_0015855b_default;
        if (PVar1 != 0x8cad) {
          PVar5 = 0x1401;
          in_ESI = Stencil;
          goto switchD_0015866d_caseD_8229;
        }
switchD_00158581_default:
        PVar5 = DepthStencil;
        goto switchD_0015855b_default;
      }
    }
    else {
      switch(PVar1) {
      case 0x8d70:
      case 0x8d76:
      case 0x8d7c:
        PVar5 = 0x1401;
        goto LAB_001584db;
      case 0x8d71:
      case 0x8d77:
      case 0x8d7d:
        PVar5 = 0x1401;
        goto LAB_001585b0;
      case 0x8d72:
      case 0x8d73:
      case 0x8d74:
      case 0x8d75:
      case 0x8d78:
      case 0x8d79:
      case 0x8d7a:
      case 0x8d7b:
      case 0x8d7e:
      case 0x8d7f:
      case 0x8d80:
      case 0x8d81:
        goto code_r0x00158844;
      case 0x8d82:
        goto switchD_00158424_caseD_8d82;
      case 0x8d83:
        goto switchD_00158424_caseD_8d83;
      }
      if (PVar1 == 0x8d62) {
        PVar5 = 0x8363;
        goto LAB_001587ba;
      }
    }
    goto switchD_00158581_caseD_8c41;
  }
  if ((int)PVar1 < 0x8051) {
    PVar6 = 0x17f830;
    switch(PVar1) {
    case Depth:
      PVar5 = 0x1405;
      in_ESI = PVar1;
      break;
    case Red:
    case 0x1904:
    case 0x1905:
      goto code_r0x00158844;
    case Alpha:
    case RGB:
    case RGBA:
    case Luminance:
    case LuminanceAlpha:
      PVar5 = 0x1401;
      in_ESI = PVar1;
      break;
    default:
      PVar5 = PVar1;
      in_ESI = PVar1;
      if (PVar1 == NoSourceFormat) break;
      PVar5 = 0x8032;
      goto LAB_001587ba;
    }
    goto switchD_0015866d_caseD_8229;
  }
  switch(PVar1) {
  case 0x8229:
  case 0x822a:
    PVar5 = 0x1401;
    break;
  case 0x822b:
  case 0x822c:
    PVar5 = 0x1401;
    goto LAB_001587e2;
  case 0x822d:
    PVar5 = 0x140b;
    break;
  case 0x822e:
    PVar5 = 0x1406;
    break;
  case 0x822f:
    PVar5 = 0x140b;
    goto LAB_001587e2;
  case 0x8230:
    PVar5 = 0x1406;
LAB_001587e2:
    in_ESI = RG;
    goto switchD_0015866d_caseD_8229;
  case 0x8231:
  case 0x8233:
  case 0x8235:
    PVar5 = 0x1400;
    goto LAB_001585d0;
  case 0x8232:
  case 0x8234:
  case 0x8236:
    PVar5 = 0x1401;
LAB_001585d0:
    in_ESI = Red_Integer;
    goto switchD_0015866d_caseD_8229;
  case 0x8237:
  case 0x8239:
  case 0x823b:
    PVar5 = 0x1400;
    goto LAB_001585e6;
  case 0x8238:
  case 0x823a:
  case 0x823c:
    PVar5 = 0x1401;
LAB_001585e6:
    in_ESI = RG_Integer;
    goto switchD_0015866d_caseD_8229;
  default:
    switch(PVar1) {
    case 0x8051:
    case 0x8054:
      PVar5 = 0x1401;
      goto LAB_001587ba;
    case 0x8052:
    case 0x8053:
    case 0x8055:
    case 0x8059:
    case 0x805a:
      goto code_r0x00158844;
    case 0x8056:
      PVar5 = 0x8033;
      break;
    case 0x8057:
      PVar5 = 0x8034;
      break;
    case 0x8058:
    case 0x805b:
      PVar5 = 0x1401;
      break;
    default:
      goto switchD_0015855b_default;
    }
LAB_001587fa:
    in_ESI = RGBA;
    goto switchD_0015866d_caseD_8229;
  }
LAB_001587ee:
  in_ESI = Red;
switchD_0015866d_caseD_8229:
  QOpenGLTexturePrivate::allocateStorage(pQVar2,in_ESI,PVar5);
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }